

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<4,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  float **ppfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  Geometry *pGVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 (*pauVar22) [16];
  uint uVar23;
  long lVar24;
  undefined4 uVar25;
  RTCIntersectArguments *pRVar26;
  ulong uVar27;
  ulong uVar28;
  Scene *pSVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 (*pauVar32) [16];
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  float fVar45;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar44;
  undefined1 auVar43 [64];
  float fVar46;
  float fVar56;
  float fVar57;
  undefined1 auVar47 [16];
  float fVar58;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar59;
  float fVar69;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar85;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar86;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar87;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar88;
  float fVar89;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar90 [16];
  float fVar97;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [64];
  float fVar116;
  undefined1 auVar117 [16];
  float fVar124;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar122;
  float fVar123;
  undefined1 auVar121 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [64];
  float fVar129;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar130 [64];
  float fVar134;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar135 [64];
  float fVar139;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar140 [64];
  float fVar144;
  undefined1 auVar145 [16];
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar146 [64];
  float fVar150;
  float fVar151;
  undefined1 auVar152 [16];
  float fVar159;
  undefined1 auVar153 [16];
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar160;
  undefined1 auVar154 [64];
  float fVar161;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar162 [64];
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1289;
  ulong local_1288;
  Scene *local_1280;
  undefined8 local_1278;
  float fStack_1270;
  float fStack_126c;
  int local_125c;
  undefined1 local_1258 [8];
  float fStack_1250;
  float fStack_124c;
  undefined8 local_1248;
  float fStack_1240;
  float fStack_123c;
  undefined1 local_1238 [16];
  ulong local_1220;
  RayHit *local_1218;
  RayQueryContext *local_1210;
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  long local_11e8;
  long local_11e0;
  RTCFilterFunctionNArguments local_11d8;
  float local_11a8;
  undefined4 local_11a4;
  undefined4 local_11a0;
  undefined4 local_119c;
  undefined4 local_1198;
  undefined4 local_1194;
  uint local_1190;
  uint local_118c;
  uint local_1188;
  undefined1 local_1178 [16];
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  undefined1 *local_1118;
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar32 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    auVar83 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar60 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar82._8_4_ = 0x7fffffff;
    auVar82._0_8_ = 0x7fffffff7fffffff;
    auVar82._12_4_ = 0x7fffffff;
    auVar82 = vandps_avx((undefined1  [16])aVar2,auVar82);
    auVar99._8_4_ = 0x219392ef;
    auVar99._0_8_ = 0x219392ef219392ef;
    auVar99._12_4_ = 0x219392ef;
    auVar82 = vcmpps_avx(auVar82,auVar99,1);
    auVar100._8_4_ = 0x3f800000;
    auVar100._0_8_ = 0x3f8000003f800000;
    auVar100._12_4_ = 0x3f800000;
    auVar99 = vdivps_avx(auVar100,(undefined1  [16])aVar2);
    auVar101._8_4_ = 0x5d5e0b6b;
    auVar101._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar101._12_4_ = 0x5d5e0b6b;
    auVar82 = vblendvps_avx(auVar99,auVar101,auVar82);
    auVar90._0_4_ = auVar82._0_4_ * 0.99999964;
    auVar90._4_4_ = auVar82._4_4_ * 0.99999964;
    auVar90._8_4_ = auVar82._8_4_ * 0.99999964;
    auVar90._12_4_ = auVar82._12_4_ * 0.99999964;
    auVar70._0_4_ = auVar82._0_4_ * 1.0000004;
    auVar70._4_4_ = auVar82._4_4_ * 1.0000004;
    auVar70._8_4_ = auVar82._8_4_ * 1.0000004;
    auVar70._12_4_ = auVar82._12_4_ * 1.0000004;
    uVar25 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_1018._4_4_ = uVar25;
    local_1018._0_4_ = uVar25;
    local_1018._8_4_ = uVar25;
    local_1018._12_4_ = uVar25;
    auVar115 = ZEXT1664(local_1018);
    uVar25 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_1028._4_4_ = uVar25;
    local_1028._0_4_ = uVar25;
    local_1028._8_4_ = uVar25;
    local_1028._12_4_ = uVar25;
    auVar121 = ZEXT1664(local_1028);
    uVar25 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_1038._4_4_ = uVar25;
    local_1038._0_4_ = uVar25;
    local_1038._8_4_ = uVar25;
    local_1038._12_4_ = uVar25;
    auVar128 = ZEXT1664(local_1038);
    local_1048 = vshufps_avx(auVar90,auVar90,0);
    auVar130 = ZEXT1664(local_1048);
    auVar82 = vmovshdup_avx(auVar90);
    local_1058 = vshufps_avx(auVar90,auVar90,0x55);
    auVar135 = ZEXT1664(local_1058);
    auVar99 = vshufpd_avx(auVar90,auVar90,1);
    local_1068 = vshufps_avx(auVar90,auVar90,0xaa);
    auVar140 = ZEXT1664(local_1068);
    local_1078 = vshufps_avx(auVar70,auVar70,0);
    auVar146 = ZEXT1664(local_1078);
    uVar31 = (ulong)(auVar90._0_4_ < 0.0) << 4;
    local_1088 = vshufps_avx(auVar70,auVar70,0x55);
    auVar154 = ZEXT1664(local_1088);
    local_1098 = vshufps_avx(auVar70,auVar70,0xaa);
    auVar162 = ZEXT1664(local_1098);
    uVar30 = (ulong)(auVar82._0_4_ < 0.0) << 4 | 0x20;
    uVar27 = (ulong)(auVar99._0_4_ < 0.0) << 4 | 0x40;
    uVar33 = uVar31 ^ 0x10;
    uVar28 = uVar30 ^ 0x10;
    local_1178 = vshufps_avx(auVar83,auVar83,0);
    auVar109 = ZEXT1664(local_1178);
    auVar82 = vshufps_avx(auVar60,auVar60,0);
    auVar43 = ZEXT1664(auVar82);
    local_1168 = mm_lookupmask_ps._240_8_;
    uStack_1160 = mm_lookupmask_ps._248_8_;
    local_1210 = context;
    local_1218 = ray;
    local_1220 = uVar31;
    local_1288 = uVar30;
LAB_00b687c0:
    if (pauVar32 != (undefined1 (*) [16])&local_f78) {
      pauVar22 = pauVar32 + -1;
      pauVar32 = pauVar32 + -1;
      if (*(float *)(*pauVar22 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar35 = *(ulong *)*pauVar32;
        while ((uVar35 & 8) == 0) {
          auVar82 = vsubps_avx(*(undefined1 (*) [16])(uVar35 + 0x20 + uVar31),auVar115._0_16_);
          auVar83._0_4_ = auVar130._0_4_ * auVar82._0_4_;
          auVar83._4_4_ = auVar130._4_4_ * auVar82._4_4_;
          auVar83._8_4_ = auVar130._8_4_ * auVar82._8_4_;
          auVar83._12_4_ = auVar130._12_4_ * auVar82._12_4_;
          auVar82 = vsubps_avx(*(undefined1 (*) [16])(uVar35 + 0x20 + uVar30),auVar121._0_16_);
          auVar60._0_4_ = auVar135._0_4_ * auVar82._0_4_;
          auVar60._4_4_ = auVar135._4_4_ * auVar82._4_4_;
          auVar60._8_4_ = auVar135._8_4_ * auVar82._8_4_;
          auVar60._12_4_ = auVar135._12_4_ * auVar82._12_4_;
          auVar82 = vmaxps_avx(auVar83,auVar60);
          auVar99 = vsubps_avx(*(undefined1 (*) [16])(uVar35 + 0x20 + uVar27),auVar128._0_16_);
          auVar61._0_4_ = auVar140._0_4_ * auVar99._0_4_;
          auVar61._4_4_ = auVar140._4_4_ * auVar99._4_4_;
          auVar61._8_4_ = auVar140._8_4_ * auVar99._8_4_;
          auVar61._12_4_ = auVar140._12_4_ * auVar99._12_4_;
          auVar99 = vmaxps_avx(auVar61,auVar109._0_16_);
          local_1148 = vmaxps_avx(auVar82,auVar99);
          auVar82 = vsubps_avx(*(undefined1 (*) [16])(uVar35 + 0x20 + uVar33),auVar115._0_16_);
          auVar62._0_4_ = auVar146._0_4_ * auVar82._0_4_;
          auVar62._4_4_ = auVar146._4_4_ * auVar82._4_4_;
          auVar62._8_4_ = auVar146._8_4_ * auVar82._8_4_;
          auVar62._12_4_ = auVar146._12_4_ * auVar82._12_4_;
          auVar82 = vsubps_avx(*(undefined1 (*) [16])(uVar35 + 0x20 + uVar28),auVar121._0_16_);
          auVar71._0_4_ = auVar154._0_4_ * auVar82._0_4_;
          auVar71._4_4_ = auVar154._4_4_ * auVar82._4_4_;
          auVar71._8_4_ = auVar154._8_4_ * auVar82._8_4_;
          auVar71._12_4_ = auVar154._12_4_ * auVar82._12_4_;
          auVar82 = vminps_avx(auVar62,auVar71);
          auVar99 = vsubps_avx(*(undefined1 (*) [16])(uVar35 + 0x20 + (uVar27 ^ 0x10)),
                               auVar128._0_16_);
          auVar72._0_4_ = auVar162._0_4_ * auVar99._0_4_;
          auVar72._4_4_ = auVar162._4_4_ * auVar99._4_4_;
          auVar72._8_4_ = auVar162._8_4_ * auVar99._8_4_;
          auVar72._12_4_ = auVar162._12_4_ * auVar99._12_4_;
          auVar99 = vminps_avx(auVar72,auVar43._0_16_);
          auVar82 = vminps_avx(auVar82,auVar99);
          auVar82 = vcmpps_avx(local_1148,auVar82,2);
          uVar23 = vmovmskps_avx(auVar82);
          if (uVar23 == 0) goto LAB_00b687c0;
          uVar23 = uVar23 & 0xff;
          uVar34 = uVar35 & 0xfffffffffffffff0;
          lVar24 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
            }
          }
          uVar35 = *(ulong *)(uVar34 + lVar24 * 8);
          uVar23 = uVar23 - 1 & uVar23;
          if (uVar23 != 0) {
            uVar5 = *(uint *)(local_1148 + lVar24 * 4);
            lVar24 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
              }
            }
            uVar7 = *(ulong *)(uVar34 + lVar24 * 8);
            uVar6 = *(uint *)(local_1148 + lVar24 * 4);
            uVar23 = uVar23 - 1 & uVar23;
            uVar30 = local_1288;
            if (uVar23 == 0) {
              if (uVar5 < uVar6) {
                *(ulong *)*pauVar32 = uVar7;
                *(uint *)(*pauVar32 + 8) = uVar6;
                pauVar32 = pauVar32 + 1;
              }
              else {
                *(ulong *)*pauVar32 = uVar35;
                *(uint *)(*pauVar32 + 8) = uVar5;
                pauVar32 = pauVar32 + 1;
                uVar35 = uVar7;
              }
            }
            else {
              auVar47._8_8_ = 0;
              auVar47._0_8_ = uVar35;
              auVar82 = vpunpcklqdq_avx(auVar47,ZEXT416(uVar5));
              auVar63._8_8_ = 0;
              auVar63._0_8_ = uVar7;
              auVar99 = vpunpcklqdq_avx(auVar63,ZEXT416(uVar6));
              lVar24 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                }
              }
              auVar73._8_8_ = 0;
              auVar73._0_8_ = *(ulong *)(uVar34 + lVar24 * 8);
              auVar60 = vpunpcklqdq_avx(auVar73,ZEXT416(*(uint *)(local_1148 + lVar24 * 4)));
              auVar83 = vpcmpgtd_avx(auVar99,auVar82);
              uVar23 = uVar23 - 1 & uVar23;
              if (uVar23 == 0) {
                auVar70 = vpshufd_avx(auVar83,0xaa);
                auVar83 = vblendvps_avx(auVar99,auVar82,auVar70);
                auVar82 = vblendvps_avx(auVar82,auVar99,auVar70);
                auVar99 = vpcmpgtd_avx(auVar60,auVar83);
                auVar70 = vpshufd_avx(auVar99,0xaa);
                auVar99 = vblendvps_avx(auVar60,auVar83,auVar70);
                auVar83 = vblendvps_avx(auVar83,auVar60,auVar70);
                auVar60 = vpcmpgtd_avx(auVar83,auVar82);
                auVar70 = vpshufd_avx(auVar60,0xaa);
                auVar60 = vblendvps_avx(auVar83,auVar82,auVar70);
                auVar82 = vblendvps_avx(auVar82,auVar83,auVar70);
                *pauVar32 = auVar82;
                pauVar32[1] = auVar60;
                uVar35 = auVar99._0_8_;
                pauVar32 = pauVar32 + 2;
              }
              else {
                lVar24 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                  }
                }
                auVar102._8_8_ = 0;
                auVar102._0_8_ = *(ulong *)(uVar34 + lVar24 * 8);
                auVar90 = vpunpcklqdq_avx(auVar102,ZEXT416(*(uint *)(local_1148 + lVar24 * 4)));
                auVar70 = vpshufd_avx(auVar83,0xaa);
                auVar83 = vblendvps_avx(auVar99,auVar82,auVar70);
                auVar82 = vblendvps_avx(auVar82,auVar99,auVar70);
                auVar99 = vpcmpgtd_avx(auVar90,auVar60);
                auVar70 = vpshufd_avx(auVar99,0xaa);
                auVar99 = vblendvps_avx(auVar90,auVar60,auVar70);
                auVar60 = vblendvps_avx(auVar60,auVar90,auVar70);
                auVar70 = vpcmpgtd_avx(auVar60,auVar82);
                auVar90 = vpshufd_avx(auVar70,0xaa);
                auVar70 = vblendvps_avx(auVar60,auVar82,auVar90);
                auVar82 = vblendvps_avx(auVar82,auVar60,auVar90);
                auVar60 = vpcmpgtd_avx(auVar99,auVar83);
                auVar90 = vpshufd_avx(auVar60,0xaa);
                auVar60 = vblendvps_avx(auVar99,auVar83,auVar90);
                auVar99 = vblendvps_avx(auVar83,auVar99,auVar90);
                auVar83 = vpcmpgtd_avx(auVar70,auVar99);
                auVar90 = vpshufd_avx(auVar83,0xaa);
                auVar83 = vblendvps_avx(auVar70,auVar99,auVar90);
                auVar99 = vblendvps_avx(auVar99,auVar70,auVar90);
                *pauVar32 = auVar82;
                pauVar32[1] = auVar99;
                pauVar32[2] = auVar83;
                auVar109 = ZEXT1664(local_1178);
                uVar35 = auVar60._0_8_;
                pauVar32 = pauVar32 + 3;
              }
            }
          }
        }
        local_11e8 = (ulong)((uint)uVar35 & 0xf) - 8;
        uVar35 = uVar35 & 0xfffffffffffffff0;
        for (local_11e0 = 0; local_11e0 != local_11e8; local_11e0 = local_11e0 + 1) {
          lVar24 = local_11e0 * 0x50;
          pSVar29 = context->scene;
          ppfVar8 = (pSVar29->vertices).items;
          pfVar9 = ppfVar8[*(uint *)(uVar35 + 0x30 + lVar24)];
          pfVar10 = ppfVar8[*(uint *)(uVar35 + 0x34 + lVar24)];
          pfVar11 = ppfVar8[*(uint *)(uVar35 + 0x38 + lVar24)];
          pfVar12 = ppfVar8[*(uint *)(uVar35 + 0x3c + lVar24)];
          auVar83 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar35 + lVar24)),
                                  *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar35 + 8 + lVar24)));
          auVar82 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar35 + lVar24)),
                                  *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar35 + 8 + lVar24)));
          auVar60 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar35 + 4 + lVar24)),
                                  *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar35 + 0xc + lVar24))
                                 );
          auVar99 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar35 + 4 + lVar24)),
                                  *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar35 + 0xc + lVar24))
                                 );
          auVar90 = vunpcklps_avx(auVar82,auVar99);
          auVar100 = vunpcklps_avx(auVar83,auVar60);
          auVar82 = vunpckhps_avx(auVar83,auVar60);
          auVar60 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar35 + 0x10 + lVar24))
                                  ,*(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar35 + 0x18 + lVar24)));
          auVar99 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar35 + 0x10 + lVar24))
                                  ,*(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar35 + 0x18 + lVar24)));
          auVar70 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar10 + *(uint *)(uVar35 + 0x14 + lVar24)),
                                  *(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar35 + 0x1c + lVar24)));
          auVar83 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar10 + *(uint *)(uVar35 + 0x14 + lVar24)),
                                  *(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar35 + 0x1c + lVar24)));
          auVar101 = vunpcklps_avx(auVar99,auVar83);
          auVar61 = vunpcklps_avx(auVar60,auVar70);
          auVar99 = vunpckhps_avx(auVar60,auVar70);
          auVar70 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar35 + 0x20 + lVar24))
                                  ,*(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar35 + 0x28 + lVar24)));
          auVar83 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar35 + 0x20 + lVar24))
                                  ,*(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar35 + 0x28 + lVar24)));
          auVar62 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar10 + *(uint *)(uVar35 + 0x24 + lVar24)),
                                  *(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar35 + 0x2c + lVar24)));
          auVar60 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar10 + *(uint *)(uVar35 + 0x24 + lVar24)),
                                  *(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar35 + 0x2c + lVar24)));
          auVar71 = vunpcklps_avx(auVar83,auVar60);
          auVar60 = vunpcklps_avx(auVar70,auVar62);
          auVar70 = vunpckhps_avx(auVar70,auVar62);
          puVar1 = (undefined8 *)(uVar35 + 0x30 + lVar24);
          local_f88 = *puVar1;
          uStack_f80 = puVar1[1];
          puVar1 = (undefined8 *)(uVar35 + 0x40 + lVar24);
          local_1158 = *puVar1;
          uStack_1150 = puVar1[1];
          uVar25 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar125._4_4_ = uVar25;
          auVar125._0_4_ = uVar25;
          auVar125._8_4_ = uVar25;
          auVar125._12_4_ = uVar25;
          uVar25 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar145._4_4_ = uVar25;
          auVar145._0_4_ = uVar25;
          auVar145._8_4_ = uVar25;
          auVar145._12_4_ = uVar25;
          uVar25 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar152._4_4_ = uVar25;
          auVar152._0_4_ = uVar25;
          auVar152._8_4_ = uVar25;
          auVar152._12_4_ = uVar25;
          local_11f8 = vsubps_avx(auVar100,auVar125);
          local_1208 = vsubps_avx(auVar82,auVar145);
          local_f98 = vsubps_avx(auVar90,auVar152);
          auVar82 = vsubps_avx(auVar61,auVar125);
          auVar99 = vsubps_avx(auVar99,auVar145);
          auVar83 = vsubps_avx(auVar101,auVar152);
          auVar60 = vsubps_avx(auVar60,auVar125);
          auVar70 = vsubps_avx(auVar70,auVar145);
          auVar90 = vsubps_avx(auVar71,auVar152);
          local_fa8 = vsubps_avx(auVar60,local_11f8);
          local_fb8 = vsubps_avx(auVar70,local_1208);
          local_fc8 = vsubps_avx(auVar90,local_f98);
          fVar14 = local_1208._0_4_;
          fVar46 = auVar70._0_4_ + fVar14;
          fVar16 = local_1208._4_4_;
          fVar56 = auVar70._4_4_ + fVar16;
          fVar85 = local_1208._8_4_;
          fVar57 = auVar70._8_4_ + fVar85;
          fVar18 = local_1208._12_4_;
          fVar58 = auVar70._12_4_ + fVar18;
          fVar129 = local_f98._0_4_;
          fVar88 = fVar129 + auVar90._0_4_;
          fVar131 = local_f98._4_4_;
          fVar93 = fVar131 + auVar90._4_4_;
          fVar132 = local_f98._8_4_;
          fVar95 = fVar132 + auVar90._8_4_;
          fVar133 = local_f98._12_4_;
          fVar97 = fVar133 + auVar90._12_4_;
          fVar59 = local_fc8._0_4_;
          auVar117._0_4_ = fVar59 * fVar46;
          fVar69 = local_fc8._4_4_;
          auVar117._4_4_ = fVar69 * fVar56;
          fVar44 = local_fc8._8_4_;
          auVar117._8_4_ = fVar44 * fVar57;
          fVar45 = local_fc8._12_4_;
          auVar117._12_4_ = fVar45 * fVar58;
          fVar161 = local_fb8._0_4_;
          auVar126._0_4_ = fVar161 * fVar88;
          fVar163 = local_fb8._4_4_;
          auVar126._4_4_ = fVar163 * fVar93;
          fVar164 = local_fb8._8_4_;
          auVar126._8_4_ = fVar164 * fVar95;
          fVar165 = local_fb8._12_4_;
          auVar126._12_4_ = fVar165 * fVar97;
          auVar100 = vsubps_avx(auVar126,auVar117);
          fVar15 = local_11f8._0_4_;
          fVar116 = auVar60._0_4_ + fVar15;
          fVar17 = local_11f8._4_4_;
          fVar122 = auVar60._4_4_ + fVar17;
          fVar87 = local_11f8._8_4_;
          fVar123 = auVar60._8_4_ + fVar87;
          fVar19 = local_11f8._12_4_;
          fVar124 = auVar60._12_4_ + fVar19;
          fVar150 = local_fa8._0_4_;
          auVar91._0_4_ = fVar150 * fVar88;
          fVar155 = local_fa8._4_4_;
          auVar91._4_4_ = fVar155 * fVar93;
          fVar157 = local_fa8._8_4_;
          auVar91._8_4_ = fVar157 * fVar95;
          fVar159 = local_fa8._12_4_;
          auVar91._12_4_ = fVar159 * fVar97;
          auVar127._0_4_ = fVar116 * fVar59;
          auVar127._4_4_ = fVar122 * fVar69;
          auVar127._8_4_ = fVar123 * fVar44;
          auVar127._12_4_ = fVar124 * fVar45;
          auVar101 = vsubps_avx(auVar127,auVar91);
          auVar118._0_4_ = fVar161 * fVar116;
          auVar118._4_4_ = fVar163 * fVar122;
          auVar118._8_4_ = fVar164 * fVar123;
          auVar118._12_4_ = fVar165 * fVar124;
          auVar36._0_4_ = fVar150 * fVar46;
          auVar36._4_4_ = fVar155 * fVar56;
          auVar36._8_4_ = fVar157 * fVar57;
          auVar36._12_4_ = fVar159 * fVar58;
          auVar61 = vsubps_avx(auVar36,auVar118);
          local_1258._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
          local_1278._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
          fStack_1240 = (ray->super_RayK<1>).dir.field_0.m128[0];
          local_1248 = (RTCIntersectArguments *)CONCAT44(fStack_1240,fStack_1240);
          fStack_123c = fStack_1240;
          local_fe8._0_4_ =
               auVar100._0_4_ * fStack_1240 +
               local_1278._4_4_ * auVar101._0_4_ + (float)local_1258._4_4_ * auVar61._0_4_;
          local_fe8._4_4_ =
               auVar100._4_4_ * fStack_1240 +
               local_1278._4_4_ * auVar101._4_4_ + (float)local_1258._4_4_ * auVar61._4_4_;
          local_fe8._8_4_ =
               auVar100._8_4_ * fStack_1240 +
               local_1278._4_4_ * auVar101._8_4_ + (float)local_1258._4_4_ * auVar61._8_4_;
          local_fe8._12_4_ =
               auVar100._12_4_ * fStack_1240 +
               local_1278._4_4_ * auVar101._12_4_ + (float)local_1258._4_4_ * auVar61._12_4_;
          local_fd8 = vsubps_avx(local_1208,auVar99);
          auVar100 = vsubps_avx(local_f98,auVar83);
          fVar46 = fVar14 + auVar99._0_4_;
          fVar56 = fVar16 + auVar99._4_4_;
          fVar57 = fVar85 + auVar99._8_4_;
          fVar58 = fVar18 + auVar99._12_4_;
          fVar88 = fVar129 + auVar83._0_4_;
          fVar93 = fVar131 + auVar83._4_4_;
          fVar95 = fVar132 + auVar83._8_4_;
          fVar97 = fVar133 + auVar83._12_4_;
          fVar134 = auVar100._0_4_;
          auVar153._0_4_ = fVar134 * fVar46;
          fVar136 = auVar100._4_4_;
          auVar153._4_4_ = fVar136 * fVar56;
          fVar137 = auVar100._8_4_;
          auVar153._8_4_ = fVar137 * fVar57;
          fVar138 = auVar100._12_4_;
          auVar153._12_4_ = fVar138 * fVar58;
          fVar144 = local_fd8._0_4_;
          auVar74._0_4_ = fVar144 * fVar88;
          fVar147 = local_fd8._4_4_;
          auVar74._4_4_ = fVar147 * fVar93;
          fVar148 = local_fd8._8_4_;
          auVar74._8_4_ = fVar148 * fVar95;
          fVar149 = local_fd8._12_4_;
          auVar74._12_4_ = fVar149 * fVar97;
          auVar100 = vsubps_avx(auVar74,auVar153);
          auVar101 = vsubps_avx(local_11f8,auVar82);
          fVar151 = auVar101._0_4_;
          auVar92._0_4_ = fVar151 * fVar88;
          fVar156 = auVar101._4_4_;
          auVar92._4_4_ = fVar156 * fVar93;
          fVar158 = auVar101._8_4_;
          auVar92._8_4_ = fVar158 * fVar95;
          fVar160 = auVar101._12_4_;
          auVar92._12_4_ = fVar160 * fVar97;
          fVar88 = fVar15 + auVar82._0_4_;
          fVar93 = fVar17 + auVar82._4_4_;
          fVar95 = fVar87 + auVar82._8_4_;
          fVar97 = fVar19 + auVar82._12_4_;
          auVar119._0_4_ = fVar134 * fVar88;
          auVar119._4_4_ = fVar136 * fVar93;
          auVar119._8_4_ = fVar137 * fVar95;
          auVar119._12_4_ = fVar138 * fVar97;
          auVar101 = vsubps_avx(auVar119,auVar92);
          auVar110._0_4_ = fVar144 * fVar88;
          auVar110._4_4_ = fVar147 * fVar93;
          auVar110._8_4_ = fVar148 * fVar95;
          auVar110._12_4_ = fVar149 * fVar97;
          auVar37._0_4_ = fVar151 * fVar46;
          auVar37._4_4_ = fVar156 * fVar56;
          auVar37._8_4_ = fVar158 * fVar57;
          auVar37._12_4_ = fVar160 * fVar58;
          auVar61 = vsubps_avx(auVar37,auVar110);
          local_1138._0_4_ =
               fStack_1240 * auVar100._0_4_ +
               local_1278._4_4_ * auVar101._0_4_ + (float)local_1258._4_4_ * auVar61._0_4_;
          local_1138._4_4_ =
               fStack_1240 * auVar100._4_4_ +
               local_1278._4_4_ * auVar101._4_4_ + (float)local_1258._4_4_ * auVar61._4_4_;
          local_1138._8_4_ =
               fStack_1240 * auVar100._8_4_ +
               local_1278._4_4_ * auVar101._8_4_ + (float)local_1258._4_4_ * auVar61._8_4_;
          local_1138._12_4_ =
               fStack_1240 * auVar100._12_4_ +
               local_1278._4_4_ * auVar101._12_4_ + (float)local_1258._4_4_ * auVar61._12_4_;
          auVar100 = vsubps_avx(auVar82,auVar60);
          fVar122 = auVar60._0_4_ + auVar82._0_4_;
          fVar123 = auVar60._4_4_ + auVar82._4_4_;
          fVar124 = auVar60._8_4_ + auVar82._8_4_;
          fVar86 = auVar60._12_4_ + auVar82._12_4_;
          auVar82 = vsubps_avx(auVar99,auVar70);
          fVar93 = auVar99._0_4_ + auVar70._0_4_;
          fVar95 = auVar99._4_4_ + auVar70._4_4_;
          fVar97 = auVar99._8_4_ + auVar70._8_4_;
          fVar116 = auVar99._12_4_ + auVar70._12_4_;
          auVar99 = vsubps_avx(auVar83,auVar90);
          fVar56 = auVar83._0_4_ + auVar90._0_4_;
          fVar57 = auVar83._4_4_ + auVar90._4_4_;
          fVar58 = auVar83._8_4_ + auVar90._8_4_;
          fVar88 = auVar83._12_4_ + auVar90._12_4_;
          fVar89 = auVar99._0_4_;
          auVar103._0_4_ = fVar89 * fVar93;
          fVar94 = auVar99._4_4_;
          auVar103._4_4_ = fVar94 * fVar95;
          fVar96 = auVar99._8_4_;
          auVar103._8_4_ = fVar96 * fVar97;
          fVar98 = auVar99._12_4_;
          auVar103._12_4_ = fVar98 * fVar116;
          fVar139 = auVar82._0_4_;
          auVar111._0_4_ = fVar139 * fVar56;
          fVar141 = auVar82._4_4_;
          auVar111._4_4_ = fVar141 * fVar57;
          fVar142 = auVar82._8_4_;
          auVar111._8_4_ = fVar142 * fVar58;
          fVar143 = auVar82._12_4_;
          auVar111._12_4_ = fVar143 * fVar88;
          auVar82 = vsubps_avx(auVar111,auVar103);
          fVar46 = auVar100._0_4_;
          auVar48._0_4_ = fVar46 * fVar56;
          fVar56 = auVar100._4_4_;
          auVar48._4_4_ = fVar56 * fVar57;
          fVar57 = auVar100._8_4_;
          auVar48._8_4_ = fVar57 * fVar58;
          fVar58 = auVar100._12_4_;
          auVar48._12_4_ = fVar58 * fVar88;
          auVar112._0_4_ = fVar89 * fVar122;
          auVar112._4_4_ = fVar94 * fVar123;
          auVar112._8_4_ = fVar96 * fVar124;
          auVar112._12_4_ = fVar98 * fVar86;
          auVar99 = vsubps_avx(auVar112,auVar48);
          auVar75._0_4_ = fVar139 * fVar122;
          auVar75._4_4_ = fVar141 * fVar123;
          auVar75._8_4_ = fVar142 * fVar124;
          auVar75._12_4_ = fVar143 * fVar86;
          auVar64._0_4_ = fVar46 * fVar93;
          auVar64._4_4_ = fVar56 * fVar95;
          auVar64._8_4_ = fVar57 * fVar97;
          auVar64._12_4_ = fVar58 * fVar116;
          auVar83 = vsubps_avx(auVar64,auVar75);
          local_1258._0_4_ = local_1258._4_4_;
          fStack_1250 = (float)local_1258._4_4_;
          fStack_124c = (float)local_1258._4_4_;
          local_1278._0_4_ = local_1278._4_4_;
          fStack_1270 = local_1278._4_4_;
          fStack_126c = local_1278._4_4_;
          auVar49._0_4_ =
               fStack_1240 * auVar82._0_4_ +
               local_1278._4_4_ * auVar99._0_4_ + (float)local_1258._4_4_ * auVar83._0_4_;
          auVar49._4_4_ =
               fStack_1240 * auVar82._4_4_ +
               local_1278._4_4_ * auVar99._4_4_ + (float)local_1258._4_4_ * auVar83._4_4_;
          auVar49._8_4_ =
               fStack_1240 * auVar82._8_4_ +
               local_1278._4_4_ * auVar99._8_4_ + (float)local_1258._4_4_ * auVar83._8_4_;
          auVar49._12_4_ =
               fStack_1240 * auVar82._12_4_ +
               local_1278._4_4_ * auVar99._12_4_ + (float)local_1258._4_4_ * auVar83._12_4_;
          local_1128._0_4_ = auVar49._0_4_ + local_fe8._0_4_ + local_1138._0_4_;
          local_1128._4_4_ = auVar49._4_4_ + local_fe8._4_4_ + local_1138._4_4_;
          local_1128._8_4_ = auVar49._8_4_ + local_fe8._8_4_ + local_1138._8_4_;
          local_1128._12_4_ = auVar49._12_4_ + local_fe8._12_4_ + local_1138._12_4_;
          auVar82 = vminps_avx(local_fe8,local_1138);
          auVar82 = vminps_avx(auVar82,auVar49);
          auVar76._8_4_ = 0x7fffffff;
          auVar76._0_8_ = 0x7fffffff7fffffff;
          auVar76._12_4_ = 0x7fffffff;
          local_ff8 = vandps_avx(local_1128,auVar76);
          auVar77._0_4_ = local_ff8._0_4_ * 1.1920929e-07;
          auVar77._4_4_ = local_ff8._4_4_ * 1.1920929e-07;
          auVar77._8_4_ = local_ff8._8_4_ * 1.1920929e-07;
          auVar77._12_4_ = local_ff8._12_4_ * 1.1920929e-07;
          uVar34 = CONCAT44(auVar77._4_4_,auVar77._0_4_);
          auVar104._0_8_ = uVar34 ^ 0x8000000080000000;
          auVar104._8_4_ = -auVar77._8_4_;
          auVar104._12_4_ = -auVar77._12_4_;
          auVar82 = vcmpps_avx(auVar82,auVar104,5);
          auVar99 = vmaxps_avx(local_fe8,local_1138);
          auVar99 = vmaxps_avx(auVar99,auVar49);
          auVar99 = vcmpps_avx(auVar99,auVar77,2);
          local_1008 = vorps_avx(auVar82,auVar99);
          local_1289 = 0;
          auVar20._8_8_ = uStack_1160;
          auVar20._0_8_ = local_1168;
          auVar20 = auVar20 & local_1008;
          if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar20[0xf] < '\0') {
            auVar50._0_4_ = fVar59 * fVar144;
            auVar50._4_4_ = fVar69 * fVar147;
            auVar50._8_4_ = fVar44 * fVar148;
            auVar50._12_4_ = fVar45 * fVar149;
            auVar65._0_4_ = fVar161 * fVar134;
            auVar65._4_4_ = fVar163 * fVar136;
            auVar65._8_4_ = fVar164 * fVar137;
            auVar65._12_4_ = fVar165 * fVar138;
            auVar83 = vsubps_avx(auVar65,auVar50);
            auVar78._0_4_ = fVar134 * fVar139;
            auVar78._4_4_ = fVar136 * fVar141;
            auVar78._8_4_ = fVar137 * fVar142;
            auVar78._12_4_ = fVar138 * fVar143;
            auVar105._0_4_ = fVar144 * fVar89;
            auVar105._4_4_ = fVar147 * fVar94;
            auVar105._8_4_ = fVar148 * fVar96;
            auVar105._12_4_ = fVar149 * fVar98;
            auVar60 = vsubps_avx(auVar105,auVar78);
            auVar113._8_4_ = 0x7fffffff;
            auVar113._0_8_ = 0x7fffffff7fffffff;
            auVar113._12_4_ = 0x7fffffff;
            auVar82 = vandps_avx(auVar50,auVar113);
            auVar99 = vandps_avx(auVar78,auVar113);
            auVar82 = vcmpps_avx(auVar82,auVar99,1);
            local_10c8 = vblendvps_avx(auVar60,auVar83,auVar82);
            auVar51._0_4_ = fVar151 * fVar89;
            auVar51._4_4_ = fVar156 * fVar94;
            auVar51._8_4_ = fVar158 * fVar96;
            auVar51._12_4_ = fVar160 * fVar98;
            auVar66._0_4_ = fVar59 * fVar151;
            auVar66._4_4_ = fVar69 * fVar156;
            auVar66._8_4_ = fVar44 * fVar158;
            auVar66._12_4_ = fVar45 * fVar160;
            auVar79._0_4_ = fVar150 * fVar134;
            auVar79._4_4_ = fVar155 * fVar136;
            auVar79._8_4_ = fVar157 * fVar137;
            auVar79._12_4_ = fVar159 * fVar138;
            auVar83 = vsubps_avx(auVar66,auVar79);
            auVar106._0_4_ = fVar134 * fVar46;
            auVar106._4_4_ = fVar136 * fVar56;
            auVar106._8_4_ = fVar137 * fVar57;
            auVar106._12_4_ = fVar138 * fVar58;
            auVar60 = vsubps_avx(auVar106,auVar51);
            auVar82 = vandps_avx(auVar79,auVar113);
            auVar99 = vandps_avx(auVar51,auVar113);
            auVar82 = vcmpps_avx(auVar82,auVar99,1);
            local_10b8 = vblendvps_avx(auVar60,auVar83,auVar82);
            auVar38._0_4_ = fVar144 * fVar46;
            auVar38._4_4_ = fVar147 * fVar56;
            auVar38._8_4_ = fVar148 * fVar57;
            auVar38._12_4_ = fVar149 * fVar58;
            auVar67._0_4_ = fVar150 * fVar144;
            auVar67._4_4_ = fVar155 * fVar147;
            auVar67._8_4_ = fVar157 * fVar148;
            auVar67._12_4_ = fVar159 * fVar149;
            auVar80._0_4_ = fVar161 * fVar151;
            auVar80._4_4_ = fVar163 * fVar156;
            auVar80._8_4_ = fVar164 * fVar158;
            auVar80._12_4_ = fVar165 * fVar160;
            auVar107._0_4_ = fVar151 * fVar139;
            auVar107._4_4_ = fVar156 * fVar141;
            auVar107._8_4_ = fVar158 * fVar142;
            auVar107._12_4_ = fVar160 * fVar143;
            auVar83 = vsubps_avx(auVar67,auVar80);
            auVar60 = vsubps_avx(auVar107,auVar38);
            auVar82 = vandps_avx(auVar80,auVar113);
            auVar99 = vandps_avx(auVar38,auVar113);
            auVar82 = vcmpps_avx(auVar82,auVar99,1);
            local_10a8 = vblendvps_avx(auVar60,auVar83,auVar82);
            fVar59 = local_10c8._0_4_ * fStack_1240 +
                     local_10b8._0_4_ * local_1278._4_4_ +
                     local_10a8._0_4_ * (float)local_1258._4_4_;
            fVar46 = local_10c8._4_4_ * fStack_1240 +
                     local_10b8._4_4_ * local_1278._4_4_ +
                     local_10a8._4_4_ * (float)local_1258._4_4_;
            fVar69 = local_10c8._8_4_ * fStack_1240 +
                     local_10b8._8_4_ * local_1278._4_4_ +
                     local_10a8._8_4_ * (float)local_1258._4_4_;
            fVar56 = local_10c8._12_4_ * fStack_1240 +
                     local_10b8._12_4_ * local_1278._4_4_ +
                     local_10a8._12_4_ * (float)local_1258._4_4_;
            auVar68._0_4_ = fVar59 + fVar59;
            auVar68._4_4_ = fVar46 + fVar46;
            auVar68._8_4_ = fVar69 + fVar69;
            auVar68._12_4_ = fVar56 + fVar56;
            fVar59 = local_10c8._0_4_ * fVar15 +
                     local_10b8._0_4_ * fVar14 + local_10a8._0_4_ * fVar129;
            fVar46 = local_10c8._4_4_ * fVar17 +
                     local_10b8._4_4_ * fVar16 + local_10a8._4_4_ * fVar131;
            fVar85 = local_10c8._8_4_ * fVar87 +
                     local_10b8._8_4_ * fVar85 + local_10a8._8_4_ * fVar132;
            fVar87 = local_10c8._12_4_ * fVar19 +
                     local_10b8._12_4_ * fVar18 + local_10a8._12_4_ * fVar133;
            auVar82 = vrcpps_avx(auVar68);
            fVar14 = auVar82._0_4_;
            auVar114._0_4_ = auVar68._0_4_ * fVar14;
            fVar15 = auVar82._4_4_;
            auVar114._4_4_ = auVar68._4_4_ * fVar15;
            fVar16 = auVar82._8_4_;
            auVar114._8_4_ = auVar68._8_4_ * fVar16;
            fVar17 = auVar82._12_4_;
            auVar114._12_4_ = auVar68._12_4_ * fVar17;
            auVar120._8_4_ = 0x3f800000;
            auVar120._0_8_ = 0x3f8000003f800000;
            auVar120._12_4_ = 0x3f800000;
            auVar82 = vsubps_avx(auVar120,auVar114);
            local_10d8._0_4_ = (fVar59 + fVar59) * (fVar14 + fVar14 * auVar82._0_4_);
            local_10d8._4_4_ = (fVar46 + fVar46) * (fVar15 + fVar15 * auVar82._4_4_);
            local_10d8._8_4_ = (fVar85 + fVar85) * (fVar16 + fVar16 * auVar82._8_4_);
            local_10d8._12_4_ = (fVar87 + fVar87) * (fVar17 + fVar17 * auVar82._12_4_);
            auVar43 = ZEXT1664(local_10d8);
            uVar25 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
            auVar81._4_4_ = uVar25;
            auVar81._0_4_ = uVar25;
            auVar81._8_4_ = uVar25;
            auVar81._12_4_ = uVar25;
            auVar82 = vcmpps_avx(auVar81,local_10d8,2);
            fVar14 = (ray->super_RayK<1>).tfar;
            auVar108._4_4_ = fVar14;
            auVar108._0_4_ = fVar14;
            auVar108._8_4_ = fVar14;
            auVar108._12_4_ = fVar14;
            auVar99 = vcmpps_avx(local_10d8,auVar108,2);
            auVar82 = vandps_avx(auVar82,auVar99);
            auVar99 = vcmpps_avx(auVar68,_DAT_01f45a50,4);
            auVar82 = vandps_avx(auVar99,auVar82);
            auVar21._8_8_ = uStack_1160;
            auVar21._0_8_ = local_1168;
            auVar99 = vandps_avx(local_1008,auVar21);
            auVar82 = vpslld_avx(auVar82,0x1f);
            auVar83 = vpsrad_avx(auVar82,0x1f);
            auVar82 = auVar99 & auVar83;
            if ((((auVar82 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar82 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar82 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar82[0xf] < '\0') {
              auVar3._0_4_ = (ray->super_RayK<1>).tfar;
              auVar3._4_4_ = (ray->super_RayK<1>).mask;
              auVar3._8_4_ = (ray->super_RayK<1>).id;
              auVar3._12_4_ = (ray->super_RayK<1>).flags;
              auVar109 = ZEXT1664(auVar3);
              auVar99 = vandps_avx(auVar83,auVar99);
              local_1148 = local_fe8;
              local_1118 = &local_1289;
              local_1108 = auVar99;
              local_1238 = auVar99;
              auVar82 = vrcpps_avx(local_1128);
              fVar14 = auVar82._0_4_;
              auVar52._0_4_ = local_1128._0_4_ * fVar14;
              fVar15 = auVar82._4_4_;
              auVar52._4_4_ = local_1128._4_4_ * fVar15;
              fVar16 = auVar82._8_4_;
              auVar52._8_4_ = local_1128._8_4_ * fVar16;
              fVar17 = auVar82._12_4_;
              auVar52._12_4_ = local_1128._12_4_ * fVar17;
              auVar84._8_4_ = 0x3f800000;
              auVar84._0_8_ = 0x3f8000003f800000;
              auVar84._12_4_ = 0x3f800000;
              auVar82 = vsubps_avx(auVar84,auVar52);
              auVar39._0_4_ = fVar14 + fVar14 * auVar82._0_4_;
              auVar39._4_4_ = fVar15 + fVar15 * auVar82._4_4_;
              auVar39._8_4_ = fVar16 + fVar16 * auVar82._8_4_;
              auVar39._12_4_ = fVar17 + fVar17 * auVar82._12_4_;
              auVar53._8_4_ = 0x219392ef;
              auVar53._0_8_ = 0x219392ef219392ef;
              auVar53._12_4_ = 0x219392ef;
              auVar82 = vcmpps_avx(local_ff8,auVar53,5);
              auVar82 = vandps_avx(auVar82,auVar39);
              auVar54._0_4_ = local_fe8._0_4_ * auVar82._0_4_;
              auVar54._4_4_ = local_fe8._4_4_ * auVar82._4_4_;
              auVar54._8_4_ = local_fe8._8_4_ * auVar82._8_4_;
              auVar54._12_4_ = local_fe8._12_4_ * auVar82._12_4_;
              local_10f8 = vminps_avx(auVar54,auVar84);
              auVar40._0_4_ = local_1138._0_4_ * auVar82._0_4_;
              auVar40._4_4_ = local_1138._4_4_ * auVar82._4_4_;
              auVar40._8_4_ = local_1138._8_4_ * auVar82._8_4_;
              auVar40._12_4_ = local_1138._12_4_ * auVar82._12_4_;
              local_10e8 = vminps_avx(auVar40,auVar84);
              auVar41._8_4_ = 0x7f800000;
              auVar41._0_8_ = 0x7f8000007f800000;
              auVar41._12_4_ = 0x7f800000;
              auVar82 = vblendvps_avx(auVar41,local_10d8,auVar99);
              auVar83 = vshufps_avx(auVar82,auVar82,0xb1);
              auVar83 = vminps_avx(auVar83,auVar82);
              auVar60 = vshufpd_avx(auVar83,auVar83,1);
              auVar83 = vminps_avx(auVar60,auVar83);
              auVar82 = vcmpps_avx(auVar82,auVar83,0);
              auVar83 = auVar99 & auVar82;
              if ((((auVar83 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar83 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar83 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar83[0xf] < '\0') {
                auVar99 = vandps_avx(auVar82,auVar99);
              }
              uVar23 = vextractps_avx(auVar3,1);
              uVar25 = vmovmskps_avx(auVar99);
              uVar34 = CONCAT44((int)((ulong)pfVar12 >> 0x20),uVar25);
              lVar24 = 0;
              local_1280 = pSVar29;
              if (uVar34 != 0) {
                for (; (uVar34 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                }
              }
LAB_00b6905a:
              local_1190 = *(uint *)((long)&local_f88 + lVar24 * 4);
              pRVar26 = (RTCIntersectArguments *)(ulong)local_1190;
              pGVar13 = (pSVar29->geometries).items[(long)pRVar26].ptr;
              if ((pGVar13->mask & uVar23) == 0) {
                *(undefined4 *)(local_1238 + lVar24 * 4) = 0;
              }
              else {
                local_1248 = context->args;
                local_1208 = auVar109._0_16_;
                if (context->args->filter == (RTCFilterFunctionN)0x0) {
                  local_11d8.context = context->user;
                  if (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                    fVar14 = *(float *)(local_10f8 + lVar24 * 4);
                    fVar15 = *(float *)(local_10e8 + lVar24 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_10d8 + lVar24 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_10c8 + lVar24 * 4);
                    (ray->Ng).field_0.field_0.y = *(float *)(local_10b8 + lVar24 * 4);
                    (ray->Ng).field_0.field_0.z = *(float *)(local_10a8 + lVar24 * 4);
                    ray->u = fVar14;
                    ray->v = fVar15;
                    ray->primID = *(uint *)((long)&local_1158 + lVar24 * 4);
                    ray->geomID = local_1190;
                    ray->instID[0] = (local_11d8.context)->instID[0];
                    ray->instPrimID[0] = (local_11d8.context)->instPrimID[0];
                    goto LAB_00b693bd;
                  }
                }
                else {
                  local_11d8.context = context->user;
                }
                local_11a8 = *(float *)(local_10c8 + lVar24 * 4);
                local_11a4 = *(undefined4 *)(local_10b8 + lVar24 * 4);
                local_11a0 = *(undefined4 *)(local_10a8 + lVar24 * 4);
                local_119c = *(undefined4 *)(local_10f8 + lVar24 * 4);
                local_1198 = *(undefined4 *)(local_10e8 + lVar24 * 4);
                local_1194 = *(undefined4 *)((long)&local_1158 + lVar24 * 4);
                local_118c = (local_11d8.context)->instID[0];
                local_1188 = (local_11d8.context)->instPrimID[0];
                (ray->super_RayK<1>).tfar = *(float *)(local_10d8 + lVar24 * 4);
                local_125c = -1;
                local_11d8.valid = &local_125c;
                pRVar26 = (RTCIntersectArguments *)pGVar13->userPtr;
                local_11d8.geometryUserPtr = pRVar26;
                local_11d8.ray = (RTCRayN *)ray;
                local_11d8.hit = (RTCHitN *)&local_11a8;
                local_11d8.N = 1;
                local_1278 = (RTCIntersectArguments *)pGVar13;
                _local_1258 = auVar43._0_16_;
                local_11f8._0_8_ = lVar24;
                if (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b69249:
                  if ((local_1248->filter != (RTCFilterFunctionN)0x0) &&
                     ((pRVar26 = local_1248,
                      (local_1248->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                      RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (pRVar26 = local_1278,
                      ((ulong)local_1278[1].intersect & 0x40000000000000) != 0)))) {
                    (*local_1248->filter)(&local_11d8);
                    auVar43 = ZEXT1664(_local_1258);
                    pSVar29 = local_1280;
                    lVar24 = local_11f8._0_8_;
                    uVar30 = local_1288;
                    context = local_1210;
                    ray = local_1218;
                    uVar31 = local_1220;
                    if (*local_11d8.valid == 0) goto LAB_00b6930b;
                  }
                  (((Vec3f *)((long)local_11d8.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_11d8.hit;
                  (((Vec3f *)((long)local_11d8.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_11d8.hit + 4);
                  (((Vec3f *)((long)local_11d8.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_11d8.hit + 8);
                  *(float *)((long)local_11d8.ray + 0x3c) = *(float *)(local_11d8.hit + 0xc);
                  *(float *)((long)local_11d8.ray + 0x40) = *(float *)(local_11d8.hit + 0x10);
                  *(float *)((long)local_11d8.ray + 0x44) = *(float *)(local_11d8.hit + 0x14);
                  *(float *)((long)local_11d8.ray + 0x48) = *(float *)(local_11d8.hit + 0x18);
                  *(float *)((long)local_11d8.ray + 0x4c) = *(float *)(local_11d8.hit + 0x1c);
                  pRVar26 = (RTCIntersectArguments *)0x0;
                  *(float *)((long)local_11d8.ray + 0x50) = *(float *)(local_11d8.hit + 0x20);
                }
                else {
                  (*pGVar13->intersectionFilterN)(&local_11d8);
                  auVar43 = ZEXT1664(_local_1258);
                  pSVar29 = local_1280;
                  lVar24 = local_11f8._0_8_;
                  uVar30 = local_1288;
                  context = local_1210;
                  ray = local_1218;
                  uVar31 = local_1220;
                  if (*local_11d8.valid != 0) goto LAB_00b69249;
LAB_00b6930b:
                  (local_1218->super_RayK<1>).tfar = (float)local_1208._0_4_;
                  pSVar29 = local_1280;
                  lVar24 = local_11f8._0_8_;
                  uVar30 = local_1288;
                  context = local_1210;
                  ray = local_1218;
                  uVar31 = local_1220;
                }
                *(undefined4 *)(local_1238 + lVar24 * 4) = 0;
                fVar14 = (ray->super_RayK<1>).tfar;
                auVar42._4_4_ = fVar14;
                auVar42._0_4_ = fVar14;
                auVar42._8_4_ = fVar14;
                auVar42._12_4_ = fVar14;
                auVar82 = vcmpps_avx(auVar43._0_16_,auVar42,2);
                local_1238 = vandps_avx(auVar82,local_1238);
                auVar4._0_4_ = (ray->super_RayK<1>).tfar;
                auVar4._4_4_ = (ray->super_RayK<1>).mask;
                auVar4._8_4_ = (ray->super_RayK<1>).id;
                auVar4._12_4_ = (ray->super_RayK<1>).flags;
                auVar109 = ZEXT1664(auVar4);
                uVar23 = vextractps_avx(auVar4,1);
              }
              if ((((local_1238 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_1238 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_1238 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_1238[0xf]) goto LAB_00b693bd;
              auVar55._8_4_ = 0x7f800000;
              auVar55._0_8_ = 0x7f8000007f800000;
              auVar55._12_4_ = 0x7f800000;
              auVar82 = vblendvps_avx(auVar55,auVar43._0_16_,local_1238);
              auVar99 = vshufps_avx(auVar82,auVar82,0xb1);
              auVar99 = vminps_avx(auVar99,auVar82);
              auVar83 = vshufpd_avx(auVar99,auVar99,1);
              auVar99 = vminps_avx(auVar83,auVar99);
              auVar99 = vcmpps_avx(auVar82,auVar99,0);
              auVar83 = local_1238 & auVar99;
              auVar82 = local_1238;
              if ((((auVar83 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar83 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar83 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar83[0xf] < '\0') {
                auVar82 = vandps_avx(auVar99,local_1238);
              }
              uVar25 = vmovmskps_avx(auVar82);
              uVar34 = CONCAT44((int)((ulong)pRVar26 >> 0x20),uVar25);
              lVar24 = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                }
              }
              goto LAB_00b6905a;
            }
          }
LAB_00b693bd:
          auVar115 = ZEXT1664(local_1018);
          auVar121 = ZEXT1664(local_1028);
          auVar128 = ZEXT1664(local_1038);
          auVar130 = ZEXT1664(local_1048);
          auVar135 = ZEXT1664(local_1058);
          auVar140 = ZEXT1664(local_1068);
          auVar146 = ZEXT1664(local_1078);
          auVar154 = ZEXT1664(local_1088);
          auVar162 = ZEXT1664(local_1098);
          auVar109 = ZEXT1664(local_1178);
        }
        fVar14 = (ray->super_RayK<1>).tfar;
        auVar43 = ZEXT1664(CONCAT412(fVar14,CONCAT48(fVar14,CONCAT44(fVar14,fVar14))));
      }
      goto LAB_00b687c0;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }